

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

KindedSources * __thiscall
cmGeneratorTarget::GetKindedSources(cmGeneratorTarget *this,string *config)

{
  cmake *this_00;
  iterator iVar1;
  string *psVar2;
  ostream *poVar3;
  KindedSources *files;
  string key;
  ostringstream e;
  undefined1 auStack_1e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined1 local_198 [376];
  
  if (this->SourcesAreContextDependent == False) {
    files = (KindedSources *)
            ((this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 2);
  }
  else {
    cmsys::SystemTools::UpperCase((string *)&local_1b8,config);
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
            ::find(&(this->KindedSourcesMap)._M_t,(key_type *)&local_1b8);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header) {
      files = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
              ::operator[](&this->KindedSourcesMap,(key_type *)&local_1b8);
      ComputeKindedSources(this,files,config);
      *(undefined1 *)&((_Base_ptr)files)->_M_right = 1;
    }
    else if (*(char *)&iVar1._M_node[2]._M_right == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"The SOURCES of \"",0x10);
      psVar2 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"\" use a generator expression that depends on the SOURCES themselves.",0x44
                );
      this_00 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      GetBacktrace((cmGeneratorTarget *)auStack_1e8);
      cmake::IssueMessage(this_00,FATAL_ERROR,(string *)(auStack_1e8 + 0x10),
                          (cmListFileBacktrace *)auStack_1e8);
      if ((cmMakefile *)auStack_1e8._8_8_ != (cmMakefile *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1e8._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_1e8._16_8_ != &local_1c8) {
        operator_delete((void *)auStack_1e8._16_8_,(ulong)(local_1c8._M_allocated_capacity + 1));
      }
      if (GetKindedSources(std::__cxx11::string_const&)::empty == '\0') {
        GetKindedSources();
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
      files = &GetKindedSources::empty;
    }
    else {
      files = (KindedSources *)(iVar1._M_node + 2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_allocated_capacity != &local_1a8) {
      operator_delete((void *)local_1b8._M_allocated_capacity,local_1a8._M_allocated_capacity + 1);
    }
  }
  return (KindedSources *)(_Base_ptr)files;
}

Assistant:

cmGeneratorTarget::KindedSources const& cmGeneratorTarget::GetKindedSources(
  std::string const& config) const
{
  // If we already processed one configuration and found no dependency
  // on configuration then always use the one result.
  if (this->SourcesAreContextDependent == Tribool::False) {
    return this->KindedSourcesMap.begin()->second;
  }

  // Lookup any existing link implementation for this configuration.
  std::string const key = cmSystemTools::UpperCase(config);
  auto it = this->KindedSourcesMap.find(key);
  if (it != this->KindedSourcesMap.end()) {
    if (!it->second.Initialized) {
      std::ostringstream e;
      e << "The SOURCES of \"" << this->GetName()
        << "\" use a generator expression that depends on the "
           "SOURCES themselves.";
      this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR, e.str(), this->GetBacktrace());
      static KindedSources empty;
      return empty;
    }
    return it->second;
  }

  // Add an entry to the map for this configuration.
  KindedSources& files = this->KindedSourcesMap[key];
  this->ComputeKindedSources(files, config);
  files.Initialized = true;
  return files;
}